

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::EnumDescriptorProto::InternalSwap
          (EnumDescriptorProto *this,EnumDescriptorProto *other)

{
  InternalMetadataWithArena *this_00;
  uint32 uVar1;
  int iVar2;
  void *pvVar3;
  Rep *pRVar4;
  string *psVar5;
  EnumOptions *pEVar6;
  UnknownFieldSet *other_00;
  
  this_00 = &other->_internal_metadata_;
  if ((((ulong)(this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_ & 1) != 0) ||
     (((ulong)(this_00->
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              ).ptr_ & 1) != 0)) {
    pvVar3 = (this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_;
    if (((ulong)pvVar3 & 1) == 0) {
      other_00 = internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 ::mutable_unknown_fields_slow
                           (&this_00->
                             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                           );
    }
    else {
      other_00 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
    }
    internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,other_00);
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  pRVar4 = (this->value_).super_RepeatedPtrFieldBase.rep_;
  (this->value_).super_RepeatedPtrFieldBase.rep_ = (other->value_).super_RepeatedPtrFieldBase.rep_;
  (other->value_).super_RepeatedPtrFieldBase.rep_ = pRVar4;
  iVar2 = (this->value_).super_RepeatedPtrFieldBase.current_size_;
  (this->value_).super_RepeatedPtrFieldBase.current_size_ =
       (other->value_).super_RepeatedPtrFieldBase.current_size_;
  (other->value_).super_RepeatedPtrFieldBase.current_size_ = iVar2;
  iVar2 = (this->value_).super_RepeatedPtrFieldBase.total_size_;
  (this->value_).super_RepeatedPtrFieldBase.total_size_ =
       (other->value_).super_RepeatedPtrFieldBase.total_size_;
  (other->value_).super_RepeatedPtrFieldBase.total_size_ = iVar2;
  pRVar4 = (this->reserved_range_).super_RepeatedPtrFieldBase.rep_;
  (this->reserved_range_).super_RepeatedPtrFieldBase.rep_ =
       (other->reserved_range_).super_RepeatedPtrFieldBase.rep_;
  (other->reserved_range_).super_RepeatedPtrFieldBase.rep_ = pRVar4;
  iVar2 = (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_ =
       (other->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  (other->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = iVar2;
  iVar2 = (this->reserved_range_).super_RepeatedPtrFieldBase.total_size_;
  (this->reserved_range_).super_RepeatedPtrFieldBase.total_size_ =
       (other->reserved_range_).super_RepeatedPtrFieldBase.total_size_;
  (other->reserved_range_).super_RepeatedPtrFieldBase.total_size_ = iVar2;
  pRVar4 = (this->reserved_name_).super_RepeatedPtrFieldBase.rep_;
  (this->reserved_name_).super_RepeatedPtrFieldBase.rep_ =
       (other->reserved_name_).super_RepeatedPtrFieldBase.rep_;
  (other->reserved_name_).super_RepeatedPtrFieldBase.rep_ = pRVar4;
  iVar2 = (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
  (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ =
       (other->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
  (other->reserved_name_).super_RepeatedPtrFieldBase.current_size_ = iVar2;
  iVar2 = (this->reserved_name_).super_RepeatedPtrFieldBase.total_size_;
  (this->reserved_name_).super_RepeatedPtrFieldBase.total_size_ =
       (other->reserved_name_).super_RepeatedPtrFieldBase.total_size_;
  (other->reserved_name_).super_RepeatedPtrFieldBase.total_size_ = iVar2;
  psVar5 = (this->name_).ptr_;
  (this->name_).ptr_ = (other->name_).ptr_;
  (other->name_).ptr_ = psVar5;
  pEVar6 = this->options_;
  this->options_ = other->options_;
  other->options_ = pEVar6;
  return;
}

Assistant:

void EnumDescriptorProto::InternalSwap(EnumDescriptorProto* other) {
  using std::swap;
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  value_.InternalSwap(&other->value_);
  reserved_range_.InternalSwap(&other->reserved_range_);
  reserved_name_.InternalSwap(&other->reserved_name_);
  name_.Swap(&other->name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  swap(options_, other->options_);
}